

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_info.c
# Opt level: O2

apx_error_t
rmf_fileInfo_set_digest_data(rmf_fileInfo_t *self,rmf_digestType_t digest_type,uint8_t *digest_data)

{
  apx_error_t aVar1;
  size_t __n;
  
  aVar1 = 1;
  if (self != (rmf_fileInfo_t *)0x0) {
    if (digest_type == '\0') {
      self->digest_data[0x10] = '\0';
      self->digest_data[0x11] = '\0';
      self->digest_data[0x12] = '\0';
      self->digest_data[0x13] = '\0';
      self->digest_data[0x14] = '\0';
      self->digest_data[0x15] = '\0';
      self->digest_data[0x16] = '\0';
      self->digest_data[0x17] = '\0';
      self->digest_data[0x18] = '\0';
      self->digest_data[0x19] = '\0';
      self->digest_data[0x1a] = '\0';
      self->digest_data[0x1b] = '\0';
      self->digest_data[0x1c] = '\0';
      self->digest_data[0x1d] = '\0';
      self->digest_data[0x1e] = '\0';
      self->digest_data[0x1f] = '\0';
      self->digest_data[0] = '\0';
      self->digest_data[1] = '\0';
      self->digest_data[2] = '\0';
      self->digest_data[3] = '\0';
      self->digest_data[4] = '\0';
      self->digest_data[5] = '\0';
      self->digest_data[6] = '\0';
      self->digest_data[7] = '\0';
      self->digest_data[8] = '\0';
      self->digest_data[9] = '\0';
      self->digest_data[10] = '\0';
      self->digest_data[0xb] = '\0';
      self->digest_data[0xc] = '\0';
      self->digest_data[0xd] = '\0';
      self->digest_data[0xe] = '\0';
      self->digest_data[0xf] = '\0';
      aVar1 = 0;
    }
    else if (digest_data != (uint8_t *)0x0) {
      __n = 0x20;
      if (digest_type == '\x01') {
        __n = 0x14;
      }
      memcpy(self->digest_data,digest_data,__n);
      return 0;
    }
  }
  return aVar1;
}

Assistant:

apx_error_t rmf_fileInfo_set_digest_data(rmf_fileInfo_t* self, rmf_digestType_t digest_type, const uint8_t* digest_data)
{
   if (self != NULL)
   {
      if (digest_type != RMF_DIGEST_TYPE_NONE)
      {
         if (digest_data == NULL)
         {
            return APX_INVALID_ARGUMENT_ERROR;
         }
         size_t size = (digest_type == RMF_DIGEST_TYPE_SHA1) ? RMF_SHA1_SIZE : RMF_SHA256_SIZE;
         memcpy(&self->digest_data[0], digest_data, size);
      }
      else
      {
         memset(&self->digest_data[0], 0, sizeof(self->digest_data));
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}